

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O3

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 uVar6;
  int iVar7;
  double *pdVar8;
  undefined4 extraout_var;
  double *pdVar9;
  double *pdVar10;
  uchar uVar11;
  bool bVar12;
  uint uVar13;
  undefined8 in_R10;
  undefined4 in_R11D;
  bool bVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double dStack_1e0;
  uint local_1cc;
  double local_1c8 [2];
  double local_1b8 [2];
  double local_1a8;
  uint local_19c;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  IkSolutionListBase<double> *local_170;
  double local_168;
  double local_160;
  double local_158;
  double dStack_150;
  double local_148;
  ulong uStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_118;
  ulong uStack_110;
  double local_108;
  double dStack_100;
  double local_f8 [2];
  double local_e8 [2];
  double local_d8 [2];
  double local_c8 [2];
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  this->j0 = NAN;
  this->j1 = NAN;
  this->j2 = NAN;
  this->j3 = NAN;
  this->j4 = NAN;
  this->j5 = NAN;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  this->_ij1[0] = 0xff;
  *(undefined4 *)(this->_ij1 + 1) = 0xffffffff;
  this->_nj2 = 0xff;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  this->_ij5[0] = 0xff;
  *(undefined2 *)(this->_ij5 + 1) = 0xffff;
  (*solutions->_vptr_IkSolutionListBase[5])(solutions);
  dVar16 = *eerot;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar16;
  this->r00 = dVar16;
  dVar19 = eerot[1];
  this->r01 = dVar19;
  local_188 = eerot[2];
  this->r02 = local_188;
  dVar27 = eerot[3];
  this->r10 = dVar27;
  local_1e8 = eerot[4];
  this->r11 = local_1e8;
  dStack_1e0 = 0.0;
  dVar31 = eerot[5];
  this->r12 = dVar31;
  dVar29 = eerot[6];
  this->r20 = dVar29;
  dVar33 = eerot[7];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar33;
  this->r21 = dVar33;
  dVar26 = eerot[8];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar26;
  this->r22 = dVar26;
  dVar17 = *eetrans;
  this->px = dVar17;
  local_198 = eetrans[1];
  uStack_190 = 0;
  this->py = local_198;
  dVar20 = eetrans[2];
  this->new_r00 = local_188;
  this->new_r01 = dVar19;
  auVar1 = _DAT_00132050;
  auVar18 = auVar18 ^ _DAT_00132050;
  auVar23._0_8_ = auVar18._0_8_;
  auVar23._8_4_ = auVar18._0_4_;
  auVar23._12_4_ = auVar18._4_4_;
  this->new_r02 = auVar23._0_8_;
  this->r02 = (IkReal)auVar23._8_8_;
  this->new_r10 = -dVar31;
  this->r10 = -dVar31;
  this->new_r11 = -local_1e8;
  this->r11 = -local_1e8;
  this->new_r12 = dVar27;
  auVar32 = auVar32 ^ auVar1;
  auVar24._0_8_ = auVar32._0_8_;
  auVar24._8_4_ = auVar32._0_4_;
  auVar24._12_4_ = auVar32._4_4_;
  this->new_r20 = auVar24._0_8_;
  this->r20 = (IkReal)auVar24._8_8_;
  auVar28 = auVar28 ^ auVar1;
  auVar25._0_8_ = auVar28._0_8_;
  auVar25._8_4_ = auVar28._0_4_;
  auVar25._12_4_ = auVar28._4_4_;
  this->new_r21 = auVar25._0_8_;
  this->r21 = (IkReal)auVar25._8_8_;
  dVar30 = dVar29 * 0.08 + (0.4 - dVar20);
  dVar17 = dVar16 * -0.08 + dVar17;
  dVar20 = local_198 * -1.0 + dVar27 * 0.08;
  this->new_r22 = dVar29;
  this->new_pz = dVar30;
  this->r00 = local_188;
  this->r01 = dVar19;
  this->r12 = dVar27;
  this->r22 = dVar29;
  this->pz = dVar30;
  this->new_px = dVar17;
  this->px = dVar17;
  this->new_py = dVar20;
  this->py = dVar20;
  this->npx = (dVar17 * local_188 - dVar20 * dVar31) - dVar30 * dVar26;
  this->npy = (dVar17 * dVar19 - dVar20 * local_1e8) - dVar30 * dVar33;
  this->npz = auVar23._0_8_ * dVar17 + dVar27 * dVar20 + dVar29 * dVar30;
  this->pp = dVar17 * dVar17 + dVar20 * dVar20 + dVar30 * dVar30;
  this->rxp0_0 = dVar26 * dVar20 - dVar30 * dVar31;
  this->rxp0_1 = auVar24._0_8_ * dVar17 - dVar30 * local_188;
  this->rxp0_2 = dVar31 * dVar17 + local_188 * dVar20;
  this->rxp1_0 = dVar33 * dVar20 - dVar30 * local_1e8;
  this->rxp1_1 = auVar25._0_8_ * dVar17 - dVar30 * dVar19;
  this->rxp1_2 = local_1e8 * dVar17 + dVar19 * dVar20;
  this->rxp2_0 = dVar30 * dVar27 - dVar20 * dVar29;
  this->rxp2_1 = dVar29 * dVar17 + dVar16 * dVar30;
  this->rxp2_2 = -dVar27 * dVar17 - dVar16 * dVar20;
  auVar1._8_4_ = SUB84(dVar20,0);
  auVar1._0_8_ = dVar17;
  auVar1._12_4_ = (int)((ulong)dVar20 >> 0x20);
  dVar16 = SUB168(auVar1 & _DAT_00132080,8);
  dVar19 = SUB168(auVar1 & _DAT_00132080,0);
  if ((double)((ulong)(dVar19 + dVar16) & (ulong)DAT_00132080) < 1e-06) goto LAB_0011706b;
  this->_nj0 = '\x02';
  local_170 = solutions;
  if ((NAN(dVar20) || NAN(-dVar17)) || ((dVar19 <= 1e-07 && (dVar16 < 1e-07)))) goto LAB_0011706b;
  dVar16 = atan2(dVar20,-dVar17);
  dVar19 = -dVar16;
  local_1b8[0] = dVar19;
  local_148 = sin(dVar19);
  uStack_140 = extraout_XMM0_Qb;
  local_d8[0] = local_148;
  local_c8[0] = cos(dVar19);
  dVar19 = 3.14159265358979 - dVar16;
  local_1a8 = dVar19;
  local_138._0_8_ = local_c8[0];
  local_138._8_8_ = extraout_XMM0_Qb_00;
  local_1e8 = sin(dVar19);
  local_168 = local_1e8;
  local_160 = cos(dVar19);
  if (-3.14159265358979 <= dVar16) {
    if (3.14159265358979 < dVar16) {
      dVar27 = 6.28318530717959;
      goto LAB_00115708;
    }
  }
  else {
    dVar27 = -6.28318530717959;
LAB_00115708:
    local_1b8[0] = dVar27 - dVar16;
  }
  if (dVar19 <= 3.14159265358979) {
    if (dVar19 < -3.14159265358979) {
      dVar16 = 6.28318530717959;
      goto LAB_0011574a;
    }
  }
  else {
    dVar16 = -6.28318530717959;
LAB_0011574a:
    local_1a8 = dVar19 + dVar16;
  }
  local_138._0_8_ = ABS((double)local_138._0_8_ - local_160);
  local_138._8_8_ = local_138._8_8_ & 0x7fffffffffffffff;
  local_148 = ABS(local_148 - local_1e8);
  uStack_140 = uStack_140 & 0x7fffffffffffffff;
  pdVar10 = local_1b8;
  pdVar9 = local_c8;
  pdVar8 = local_d8;
  uVar11 = '\0';
  uVar15 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
  local_1cc = CONCAT31((int3)((uint)in_R11D >> 8),1);
  bVar5 = true;
  do {
    bVar4 = bVar5;
    uVar13 = (uint)uVar15;
    if ((uVar15 & 1) != 0) {
      this->_ij0[0] = uVar11;
      this->_ij0[1] = 0xff;
      if ((((bVar4) && ((double)local_138._0_8_ < 1e-06)) && ((local_1cc & 1) != 0)) &&
         (local_148 < 1e-06)) {
        this->_ij0[1] = '\x01';
        uVar13 = 0;
        local_1cc = 0;
      }
      local_19c = uVar13;
      this->j0 = *pdVar10;
      dVar16 = *pdVar9;
      this->cj0 = dVar16;
      dVar19 = *pdVar8;
      this->sj0 = dVar19;
      this->_nj2 = '\x02';
      dVar16 = this->pp * -4.328914889538 +
               this->py * 0.2164457444769 * dVar19 +
               dVar16 * 0.2164457444769 * this->px + 1.00885361500683;
      if (ABS(dVar16) <= 1.0000001) {
        dVar19 = IKasin(dVar16);
        dVar16 = -1.47519820813106 - dVar19;
        local_1c8[0] = dVar16;
        local_f8[0] = sin(dVar16);
        local_128._0_8_ = local_f8[0];
        local_128._8_8_ = extraout_XMM0_Qb_01;
        local_118 = cos(dVar16);
        dVar19 = dVar19 + 1.66639444545874;
        local_1f8 = dVar19;
        uStack_110 = extraout_XMM0_Qb_02;
        local_e8[0] = local_118;
        local_1e8 = sin(dVar19);
        local_b0 = local_1e8;
        local_1f0 = cos(dVar19);
        if (dVar16 <= 3.14159265358979) {
          if (dVar16 < -3.14159265358979) {
            local_1c8[0] = dVar16 + 6.28318530717959;
            goto LAB_00115985;
          }
        }
        else {
          local_1c8[0] = dVar16 + -6.28318530717959;
LAB_00115985:
        }
        dVar16 = -6.28318530717959;
        if ((3.14159265358979 < dVar19) || (dVar16 = 6.28318530717959, dVar19 < -3.14159265358979))
        {
          local_1f8 = dVar19 + dVar16;
        }
        local_118 = ABS(local_118 - local_1f0);
        uStack_110 = uStack_110 & 0x7fffffffffffffff;
        local_128._0_8_ = ABS((double)local_128._0_8_ - local_1e8);
        local_128._8_8_ = local_128._8_8_ & 0x7fffffffffffffff;
        uVar11 = '\0';
        bVar14 = true;
        pdVar9 = local_e8;
        pdVar10 = local_1c8;
        bVar12 = true;
        pdVar8 = local_f8;
        bVar5 = true;
        do {
          bVar3 = bVar5;
          if (!bVar14) goto LAB_00117014;
          this->_ij2[0] = uVar11;
          this->_ij2[1] = 0xff;
          if (((bVar3) && (local_118 < 1e-06)) && ((bVar12 && ((double)local_128._0_8_ < 1e-06)))) {
            this->_ij2[1] = '\x01';
            bVar14 = false;
            bVar12 = false;
          }
          this->j2 = *pdVar10;
          local_78 = *pdVar9;
          this->cj2 = local_78;
          dStack_70 = *pdVar8;
          this->sj2 = dStack_70;
          local_198 = this->pz;
          dVar31 = local_78 * local_198;
          local_58 = this->px;
          local_48 = this->py;
          local_188 = dStack_70 * local_198;
          uStack_180 = 0;
          local_68 = this->cj0;
          dStack_60 = this->sj0;
          uStack_50 = 0;
          uStack_40 = 0;
          dVar27 = local_58 * local_68;
          local_1e8 = local_48 * dStack_60;
          dVar16 = -dVar27;
          dVar19 = -local_1e8;
          dStack_1e0 = local_1e8;
          local_108 = local_78 * local_78;
          dStack_100 = local_78 * dStack_70;
          local_98 = dStack_70 * 0.365;
          uStack_90 = 0;
          local_a8 = local_78 * 0.035;
          uStack_a0 = 0;
          uStack_190 = 0;
          local_88 = local_198 * local_198;
          uStack_80 = 0;
          if (1e-06 <= ABS(local_1e8 * dStack_70 * 417.142857142857 +
                           local_78 * 40.0 * dVar16 +
                           local_188 * 40.0 +
                           dVar19 * local_78 * 40.0 +
                           dVar31 * 417.142857142857 +
                           dStack_70 * -10.4285714285714 +
                           dVar27 * dStack_70 * 417.142857142857 + local_198 * 360.0 + local_78)) {
            dVar29 = dStack_100 * 0.02555 + local_108 * 0.132 + -0.133225 + local_88;
            local_158 = ABS(dVar29);
            dStack_150 = ABS(dStack_100);
            if (ABS(ABS(local_198 * -0.025 +
                        dStack_70 * 0.114975 +
                        local_108 * -0.02555 + local_78 * -0.011025 + dStack_100 * 0.132 + 0.012775
                        + local_198 * local_1e8 + local_198 * dVar27) + local_158) < 1e-06)
            goto LAB_00115c6e;
            dVar33 = dVar27 * local_98;
            local_b8 = dVar19 * local_a8;
            dVar26 = dVar16 * local_a8;
            if (local_78 * 0.000875 +
                dVar31 * 0.365 +
                local_198 * 0.315 +
                dStack_70 * -0.009125 + local_188 * 0.035 + dVar33 + dVar19 * local_a8 +
                local_98 * local_1e8 + dVar26 == 0.0) goto LAB_00115c6e;
            this->_nj1 = '\x01';
            dVar16 = local_198 * -0.025 +
                     dStack_70 * 0.114975 +
                     local_78 * -0.011025 +
                     dStack_100 * 0.132 +
                     local_198 * dVar27 + local_198 * local_1e8 + local_108 * -0.02555 + 0.012775;
            if ((NAN(dVar29) || NAN(dVar16)) || ((local_158 < 1e-07 && (ABS(dVar16) <= 1e-07))))
            goto LAB_00117014;
            dStack_1e0 = 0.0;
            local_1e8 = local_98 * local_1e8;
            dVar19 = atan2(dVar29,dVar16);
            dVar16 = this->pz;
            dVar26 = dVar26 + this->cj2 * 0.000875 +
                              this->cj2 * 0.365 * dVar16 +
                              dVar16 * 0.035 * this->sj2 +
                              local_1e8 + dVar33 + dVar16 * 0.315 + this->sj2 * -0.009125 + local_b8
            ;
            uVar15 = -(ulong)(0.0 < dVar26);
            dVar16 = (double)(uVar15 & 0x3ff0000000000000 |
                             ~uVar15 & -(ulong)(dVar26 < 0.0) & 0xbff0000000000000);
            if ((dVar16 == 0.0) && (!NAN(dVar16))) goto LAB_00117014;
            dVar16 = (1.0 / dVar16) * 1.5707963267949 + dVar19 + -1.5707963267949;
            dVar19 = sin(dVar16);
            dVar27 = cos(dVar16);
            if (dVar16 <= 3.14159265358979) {
              if (dVar16 < -3.14159265358979) {
                dVar16 = dVar16 + 6.28318530717959;
              }
            }
            else {
              dVar16 = dVar16 + -6.28318530717959;
            }
            this->_ij1[0] = '\0';
            this->_ij1[1] = 0xff;
            this->j1 = dVar16;
            this->cj1 = dVar27;
            this->sj1 = dVar19;
            dVar19 = sin(dVar16);
            dVar27 = cos(this->j1);
            dVar31 = this->py * this->sj0;
            dVar16 = this->pz;
            dVar26 = this->cj2 * 0.035;
            dVar29 = this->sj2 * 0.365;
            dVar33 = this->px * this->cj0;
            if (1e-05 < ABS((((dVar19 * -0.025 + dVar19 * dVar33 + dVar19 * dVar31) - dVar26) +
                            dVar29) - dVar27 * dVar16)) goto LAB_00117014;
            dVar17 = this->cj2 * 0.365;
            dVar20 = this->sj2 * 0.035;
            auVar21._4_4_ =
                 -(uint)(1e-05 < ABS(dVar16 * -1.0 +
                                     dVar27 * dVar29 +
                                     dVar17 * dVar19 + dVar19 * 0.315 + dVar19 * dVar20 +
                                     dVar26 * -dVar27));
            auVar21._0_4_ =
                 -(uint)(1e-05 < ABS(((dVar27 * 0.025 + (0.315 - dVar31 * dVar27)) - dVar33 * dVar27
                                     ) + dVar17 + dVar20 + dVar16 * -dVar19));
            auVar21._8_4_ =
                 -(uint)(1e-05 < ABS(dVar33 * dVar27 * 0.63 +
                                     dVar33 * 0.05 +
                                     dVar31 * 0.05 +
                                     this->pp * -1.0 +
                                     dVar27 * 0.63 * dVar31 + dVar27 * -0.01575 + 0.0346 +
                                     dVar19 * dVar16 * 0.63));
            auVar21._12_4_ =
                 -(uint)(1e-05 < ABS(dVar27 * dVar20 +
                                     ((dVar27 * 0.315 +
                                      dVar19 * dVar26 + ((0.025 - dVar31) - dVar33)) -
                                     dVar29 * dVar19) + dVar17 * dVar27));
            iVar7 = movmskps(extraout_EAX_00,auVar21);
LAB_00116fdf:
            if (iVar7 == 0) {
              rotationfunction0(this,local_170);
            }
          }
          else {
LAB_00115c6e:
            dVar29 = local_78 * 0.365;
            local_158 = local_78;
            dStack_150 = 0.0;
            dVar33 = local_78 * 0.009125 + 0.007875;
            if (ABS(dStack_70 * -40.0 * dVar27 +
                    local_78 * 417.142857142857 * dVar19 +
                    dVar31 * -40.0 +
                    dStack_70 * local_1e8 * -40.0 +
                    local_78 * 10.4285714285714 +
                    dVar16 * local_78 * 417.142857142857 +
                    local_188 * 417.142857142857 + dVar27 * -360.0 + local_1e8 * -360.0 + 9.0 +
                    dStack_70) < 1e-06) {
LAB_0011626f:
              dVar17 = local_68 * local_68;
              dVar31 = local_48 * local_48;
              dVar26 = local_58 * local_58 * dVar17;
              if (1e-06 <= ABS((dVar27 * -3200.0 * local_1e8 +
                               dVar26 * -1600.0 +
                               local_88 * -1600.0 +
                               local_1e8 * 80.0 + dVar27 * 80.0 + dVar17 * dVar31 * 1600.0 + -1.0) -
                               dVar31 * 1600.0)) {
                dVar20 = dVar27 * 0.05 + local_1e8 * 0.05 + -0.000625;
                if (((((dVar27 * -2.0 * local_1e8 + dVar20) - dVar26) - local_88) - dVar31) +
                    dVar17 * dVar31 != 0.0) {
                  this->_nj1 = '\x01';
                  dVar31 = ((local_1e8 * -2.0 * dVar27 + dVar17 * dVar31 + (dVar20 - dVar26)) -
                           dVar31) - local_88;
                  uVar15 = -(ulong)(0.0 < dVar31);
                  dVar31 = (double)(uVar15 & 0x3ff0000000000000 |
                                   ~uVar15 & -(ulong)(dVar31 < 0.0) & 0xbff0000000000000);
                  if ((dVar31 != 0.0) || (NAN(dVar31))) {
                    dVar26 = dStack_70 * 0.035;
                    dVar16 = local_78 * 0.000875 +
                             dVar26 * -local_198 +
                             ((local_98 * dVar27 +
                              local_198 * -0.315 +
                              local_a8 * dVar19 +
                              local_a8 * dVar16 + dStack_70 * -0.009125 + local_98 * local_1e8) -
                             dVar29 * local_198);
                    dVar19 = dVar27 * -dVar26 +
                             dVar27 * -0.315 +
                             ((local_1e8 * -0.315 +
                              dStack_70 * 0.000875 +
                              dVar26 * dVar19 +
                              dVar29 * dVar19 +
                              local_a8 * local_198 + -local_198 * local_98 + dVar33) -
                             dVar27 * dVar29);
                    if ((!NAN(dVar16) && !NAN(dVar19)) &&
                       ((1e-07 < ABS(dVar19) || (1e-07 <= ABS(dVar16))))) {
                      dVar16 = atan2(dVar16,dVar19);
                      dVar16 = (1.0 / dVar31) * 1.5707963267949 + -1.5707963267949 + dVar16;
                      dVar19 = sin(dVar16);
                      dVar27 = cos(dVar16);
                      if (dVar16 <= 3.14159265358979) {
                        if (dVar16 < -3.14159265358979) {
                          dVar16 = dVar16 + 6.28318530717959;
                        }
                      }
                      else {
                        dVar16 = dVar16 + -6.28318530717959;
                      }
                      this->_ij1[0] = '\0';
                      this->_ij1[1] = 0xff;
                      this->j1 = dVar16;
                      this->cj1 = dVar27;
                      this->sj1 = dVar19;
                      dVar27 = sin(dVar16);
                      dVar31 = cos(this->j1);
                      dVar33 = this->sj2 * 0.365;
                      dVar29 = this->py * this->sj0;
                      dVar16 = this->pz;
                      dVar26 = this->cj2 * 0.035;
                      dVar19 = this->cj0 * this->px;
                      if (ABS((dVar27 * -0.025 + ((dVar29 * dVar27 + dVar27 * dVar19) - dVar26) +
                              dVar33) - dVar16 * dVar31) <= 1e-05) {
                        dVar30 = this->sj2 * 0.035;
                        dVar22 = this->cj2 * 0.365;
                        dVar17 = dVar31 * -dVar19 +
                                 -dVar16 * dVar27 +
                                 dVar31 * 0.025 + (0.315 - dVar31 * dVar29) + dVar30 + dVar22;
                        dVar20 = dVar30 * dVar27 +
                                 dVar22 * dVar27 +
                                 dVar27 * 0.315 + ((dVar33 * dVar31 - dVar26 * dVar31) - dVar16);
                        dVar16 = dVar29 * 0.05 +
                                 dVar19 * 0.05 +
                                 dVar31 * dVar29 * 0.63 +
                                 dVar16 * 0.63 * dVar27 +
                                 dVar31 * -0.01575 +
                                 this->pp * -1.0 + dVar31 * dVar19 * 0.63 + 0.0346;
                        dVar19 = dVar29 * -1.0 +
                                 dVar19 * -1.0 +
                                 dVar31 * 0.315 +
                                 dVar26 * dVar27 +
                                 dVar30 * dVar31 + dVar22 * dVar31 + dVar33 * -dVar27 + 0.025;
                        uVar6 = extraout_EAX_01;
                        goto LAB_00116fb4;
                      }
                    }
                  }
                }
              }
            }
            else {
              if (dStack_70 * -0.035 * dVar27 +
                  dStack_70 * 0.000875 +
                  local_188 * 0.365 +
                  dStack_70 * local_1e8 * -0.035 + dVar31 * -0.035 + dVar16 * dVar29 + dVar33 +
                  dVar19 * dVar29 + dVar27 * -0.315 + local_1e8 * -0.315 == 0.0) goto LAB_0011626f;
              dVar27 = dVar27 * -0.315 +
                       local_1e8 * -0.315 +
                       dStack_70 * 0.000875 +
                       local_198 * 0.365 * dStack_70 +
                       ((dVar19 * dVar29 +
                        dVar19 * dStack_70 * 0.035 +
                        ((local_78 * -0.035 * local_198 + dVar33) - dVar29 * dVar27)) -
                       dStack_70 * 0.035 * dVar27);
              uVar15 = -(ulong)(0.0 < dVar27);
              dVar27 = (double)(uVar15 & 0x3ff0000000000000 |
                               ~uVar15 & -(ulong)(dVar27 < 0.0) & 0xbff0000000000000);
              this->_nj1 = '\x01';
              if ((dVar27 != 0.0) || (NAN(dVar27))) {
                dVar31 = local_78 * -0.22995 +
                         local_108 * -0.132 +
                         dStack_70 * -0.02205 +
                         dStack_100 * -0.02555 + local_198 * local_198 + -0.10045;
                dVar16 = dStack_70 * 0.114975 +
                         dStack_100 * 0.132 +
                         dVar16 * local_198 +
                         local_78 * -0.011025 +
                         local_108 * -0.02555 + dVar19 * local_198 + local_198 * 0.025 + 0.012775;
                if ((NAN(dVar16) || NAN(dVar31)) ||
                   ((ABS(dVar31) <= 1e-07 && (ABS(dVar16) < 1e-07)))) goto LAB_00117014;
                dVar16 = atan2(dVar16,dVar31);
                dVar16 = (1.0 / dVar27) * 1.5707963267949 + -1.5707963267949 + dVar16;
                dVar19 = sin(dVar16);
                dVar27 = cos(dVar16);
                if (dVar16 <= 3.14159265358979) {
                  if (dVar16 < -3.14159265358979) {
                    dVar16 = dVar16 + 6.28318530717959;
                  }
                }
                else {
                  dVar16 = dVar16 + -6.28318530717959;
                }
                this->_ij1[0] = '\0';
                this->_ij1[1] = 0xff;
                this->j1 = dVar16;
                this->cj1 = dVar27;
                this->sj1 = dVar19;
                dVar31 = sin(dVar16);
                dVar29 = cos(this->j1);
                dVar26 = this->sj2 * 0.365;
                dVar33 = this->py * this->sj0;
                dVar27 = this->pz;
                dVar16 = this->cj2 * 0.035;
                dVar30 = this->cj0 * this->px;
                if (1e-05 < ABS((dVar31 * -0.025 + ((dVar31 * dVar30 + dVar31 * dVar33) - dVar16) +
                                dVar26) - dVar29 * dVar27)) goto LAB_00117014;
                dVar22 = this->cj2 * 0.365;
                dVar17 = this->sj2 * 0.035;
                dVar19 = dVar29 * dVar22 +
                         dVar29 * 0.315 +
                         ((((dVar29 * dVar17 + dVar31 * dVar16 + 0.025) - dVar31 * dVar26) - dVar33)
                         - dVar30);
                dVar20 = dVar16 * -dVar29 +
                         dVar31 * 0.315 +
                         dVar22 * dVar31 + dVar26 * dVar29 + dVar17 * dVar31 + -dVar27;
                dVar16 = dVar29 * -0.01575 +
                         dVar29 * dVar30 * 0.63 +
                         this->pp * -1.0 +
                         dVar31 * dVar27 * 0.63 +
                         dVar33 * 0.05 + dVar30 * 0.05 + dVar29 * 0.63 * dVar33 + 0.0346;
                dVar17 = ((((dVar29 * 0.025 + 0.315) - dVar33 * dVar29) - dVar31 * dVar27) -
                         dVar29 * dVar30) + dVar22 + dVar17;
                uVar6 = extraout_EAX;
LAB_00116fb4:
                auVar2._4_4_ = -(uint)(DAT_001320e0._8_8_ < ABS(dVar20));
                auVar2._0_4_ = -(uint)((double)DAT_001320e0 < ABS(dVar17));
                auVar2._8_4_ = -(uint)((double)DAT_001320e0 < ABS(dVar16));
                auVar2._12_4_ = -(uint)(DAT_001320e0._8_8_ < ABS(dVar19));
                iVar7 = movmskps(uVar6,auVar2);
                goto LAB_00116fdf;
              }
            }
          }
LAB_00117014:
          pdVar9 = &local_1f0;
          pdVar10 = &local_1f8;
          uVar11 = '\x01';
          pdVar8 = &local_b0;
          bVar5 = false;
        } while (bVar3);
      }
      uVar15 = (ulong)local_19c;
    }
    pdVar8 = &local_168;
    pdVar9 = &local_160;
    pdVar10 = &local_1a8;
    uVar11 = '\x01';
    solutions = local_170;
    bVar5 = false;
  } while (bVar4);
LAB_0011706b:
  iVar7 = (*solutions->_vptr_IkSolutionListBase[4])(solutions);
  return CONCAT44(extraout_var,iVar7) != 0;
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) < -1-IKFAST_SINCOS_THRESH || (((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00885361500683)+(((0.2164457444769)*cj0*px))+(((0.2164457444769)*py*sj0))+(((-4.328914889538)*pp))));
j2array[0]=((-1.47519820813106)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.66639444545874)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj2*pz);
IkReal x62=(cj0*px);
IkReal x63=(cj2*sj2);
IkReal x64=((0.365)*sj2);
IkReal x65=(py*sj0);
IkReal x66=((0.035)*cj2);
IkReal x67=((417.142857142857)*sj2);
IkReal x68=(pz*sj2);
IkReal x69=((40.0)*cj2);
j1eval[0]=((((360.0)*pz))+cj2+((x62*x67))+(((-10.4285714285714)*sj2))+(((417.142857142857)*x61))+(((-1.0)*x65*x69))+(((40.0)*x68))+(((-1.0)*x62*x69))+((x65*x67)));
j1eval[1]=((IKabs(((0.012775)+(((0.132)*x63))+(((-0.011025)*cj2))+(((-0.02555)*x60))+((pz*x65))+((pz*x62))+(((0.114975)*sj2))+(((-0.025)*pz)))))+(IKabs(((-0.133225)+(((0.132)*x60))+(pz*pz)+(((0.02555)*x63))))));
j1eval[2]=IKsign(((((-0.009125)*sj2))+(((0.035)*x68))+((x62*x64))+(((-1.0)*x65*x66))+(((0.315)*pz))+(((0.365)*x61))+((x64*x65))+(((0.000875)*cj2))+(((-1.0)*x62*x66))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(cj0*px);
IkReal x71=(pz*sj2);
IkReal x72=(cj2*pz);
IkReal x73=(py*sj0);
IkReal x74=((417.142857142857)*cj2);
IkReal x75=((0.365)*cj2);
IkReal x76=(sj2*x73);
j1eval[0]=((9.0)+(((-360.0)*x73))+(((-360.0)*x70))+(((417.142857142857)*x71))+sj2+(((-1.0)*x70*x74))+(((10.4285714285714)*cj2))+(((-40.0)*x76))+(((-40.0)*x72))+(((-1.0)*x73*x74))+(((-40.0)*sj2*x70)));
j1eval[1]=IKsign(((0.007875)+(((0.009125)*cj2))+(((-1.0)*x70*x75))+(((-0.035)*x72))+(((-0.035)*x76))+(((0.365)*x71))+(((0.000875)*sj2))+(((-1.0)*x73*x75))+(((-0.315)*x70))+(((-0.315)*x73))+(((-0.035)*sj2*x70))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x77=cj0*cj0;
IkReal x78=py*py;
IkReal x79=px*px;
IkReal x80=pz*pz;
IkReal x81=(cj0*px);
IkReal x82=(py*sj0);
IkReal x83=((1600.0)*x78);
IkReal x84=(x77*x79);
j1eval[0]=((-1.0)+((x77*x83))+(((80.0)*x81))+(((80.0)*x82))+(((-1600.0)*x80))+(((-1600.0)*x84))+(((-3200.0)*x81*x82))+(((-1.0)*x83)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x82))+(((0.05)*x81))+(((-2.0)*x81*x82))+(((-1.0)*x84))+(((-1.0)*x80))+(((-1.0)*x78))+((x77*x78))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x85=py*py;
IkReal x86=cj0*cj0;
IkReal x87=(py*sj0);
IkReal x88=((0.365)*cj2);
IkReal x89=((0.035)*sj2);
IkReal x90=((0.365)*sj2);
IkReal x91=(cj0*px);
IkReal x92=((0.035)*cj2);
CheckValue<IkReal> x93=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x87))+(((0.05)*x91))+(((-1.0)*x86*(px*px)))+((x85*x86))+(((-2.0)*x87*x91))+(((-1.0)*x85))+(((-1.0)*(pz*pz))))),-1);
if(!x93.valid){
continue;
}
CheckValue<IkReal> x94 = IKatan2WithCheck(IkReal(((((-0.009125)*sj2))+((x87*x90))+(((-1.0)*x91*x92))+(((-1.0)*x87*x92))+(((-0.315)*pz))+((x90*x91))+(((-1.0)*pz*x88))+(((-1.0)*pz*x89))+(((0.000875)*cj2)))),IkReal(((0.007875)+(((0.009125)*cj2))+(((-1.0)*pz*x90))+((pz*x92))+(((-1.0)*x87*x88))+(((-1.0)*x87*x89))+(((0.000875)*sj2))+(((-0.315)*x87))+(((-1.0)*x88*x91))+(((-0.315)*x91))+(((-1.0)*x89*x91)))),IKFAST_ATAN2_MAGTHRESH);
if(!x94.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x93.value)))+(x94.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x95=IKsin(j1);
IkReal x96=IKcos(j1);
IkReal x97=((0.365)*cj2);
IkReal x98=((0.035)*sj2);
IkReal x99=((0.365)*sj2);
IkReal x100=(py*sj0);
IkReal x101=((1.0)*pz);
IkReal x102=((0.035)*cj2);
IkReal x103=(cj0*px);
IkReal x104=((1.0)*x96);
IkReal x105=(x103*x96);
evalcond[0]=(((x100*x95))+((x103*x95))+(((-1.0)*x102))+(((-0.025)*x95))+x99+(((-1.0)*x101*x96)));
evalcond[1]=((0.315)+(((-1.0)*x100*x104))+(((0.025)*x96))+x98+x97+(((-1.0)*x101*x95))+(((-1.0)*x103*x104)));
evalcond[2]=(((x96*x99))+(((-1.0)*x102*x96))+(((-1.0)*x101))+(((0.315)*x95))+((x95*x97))+((x95*x98)));
evalcond[3]=((0.0346)+(((0.63)*x105))+(((-1.0)*pp))+(((-0.01575)*x96))+(((0.63)*pz*x95))+(((0.63)*x100*x96))+(((0.05)*x103))+(((0.05)*x100)));
evalcond[4]=((0.025)+(((-1.0)*x95*x99))+((x96*x97))+((x96*x98))+((x102*x95))+(((0.315)*x96))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x608=cj2*cj2;
IkReal x609=(py*sj0);
IkReal x610=((0.365)*cj2);
IkReal x611=((0.035)*sj2);
IkReal x612=(cj2*sj2);
IkReal x613=(cj0*px);
IkReal x614=((1.0)*pz);
CheckValue<IkReal> x615=IKPowWithIntegerCheck(IKsign(((0.007875)+(((0.009125)*cj2))+(((-0.035)*cj2*pz))+(((-1.0)*x610*x613))+(((-1.0)*x609*x611))+(((-1.0)*x609*x610))+(((-1.0)*x611*x613))+(((0.365)*pz*sj2))+(((0.000875)*sj2))+(((-0.315)*x609))+(((-0.315)*x613)))),-1);
if(!x615.valid){
continue;
}
CheckValue<IkReal> x616 = IKatan2WithCheck(IkReal(((0.012775)+(((0.025)*pz))+(((-1.0)*x609*x614))+(((-0.02555)*x608))+(((-0.011025)*cj2))+(((-1.0)*x613*x614))+(((0.132)*x612))+(((0.114975)*sj2)))),IkReal(((-0.10045)+(pz*pz)+(((-0.02555)*x612))+(((-0.02205)*sj2))+(((-0.132)*x608))+(((-0.22995)*cj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x616.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(((1.5707963267949)*(x615.value)))+(x616.value));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x617=IKsin(j1);
IkReal x618=IKcos(j1);
IkReal x619=((0.365)*cj2);
IkReal x620=((0.035)*sj2);
IkReal x621=((0.365)*sj2);
IkReal x622=(py*sj0);
IkReal x623=((1.0)*pz);
IkReal x624=((0.035)*cj2);
IkReal x625=(cj0*px);
IkReal x626=((1.0)*x618);
IkReal x627=(x618*x625);
evalcond[0]=(((x617*x625))+((x617*x622))+(((-1.0)*x624))+(((-0.025)*x617))+x621+(((-1.0)*x618*x623)));
evalcond[1]=((0.315)+(((0.025)*x618))+(((-1.0)*x622*x626))+(((-1.0)*x617*x623))+(((-1.0)*x625*x626))+x619+x620);
evalcond[2]=(((x617*x620))+(((-1.0)*x623))+((x618*x621))+((x617*x619))+(((0.315)*x617))+(((-1.0)*x618*x624)));
evalcond[3]=((0.0346)+(((0.63)*x618*x622))+(((0.05)*x625))+(((0.05)*x622))+(((0.63)*pz*x617))+(((-1.0)*pp))+(((0.63)*x627))+(((-0.01575)*x618)));
evalcond[4]=((0.025)+((x617*x624))+((x618*x620))+(((-1.0)*x617*x621))+(((-1.0)*x622))+(((-1.0)*x625))+(((0.315)*x618))+((x618*x619)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x628=cj2*cj2;
IkReal x629=(cj2*sj2);
IkReal x630=((0.365)*sj2);
IkReal x631=(py*sj0);
IkReal x632=(cj0*px);
IkReal x633=((0.035)*cj2);
CheckValue<IkReal> x634 = IKatan2WithCheck(IkReal(((-0.133225)+(((0.132)*x628))+(pz*pz)+(((0.02555)*x629)))),IkReal(((0.012775)+(((-0.02555)*x628))+((pz*x631))+((pz*x632))+(((0.132)*x629))+(((-0.011025)*cj2))+(((0.114975)*sj2))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x634.valid){
continue;
}
CheckValue<IkReal> x635=IKPowWithIntegerCheck(IKsign(((((-0.009125)*sj2))+(((-1.0)*x631*x633))+(((0.315)*pz))+((x630*x632))+((x630*x631))+(((0.035)*pz*sj2))+(((0.365)*cj2*pz))+(((0.000875)*cj2))+(((-1.0)*x632*x633)))),-1);
if(!x635.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x634.value)+(((1.5707963267949)*(x635.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x636=IKsin(j1);
IkReal x637=IKcos(j1);
IkReal x638=((0.365)*cj2);
IkReal x639=((0.035)*sj2);
IkReal x640=((0.365)*sj2);
IkReal x641=(py*sj0);
IkReal x642=((1.0)*pz);
IkReal x643=((0.035)*cj2);
IkReal x644=(cj0*px);
IkReal x645=((1.0)*x637);
IkReal x646=(x637*x644);
evalcond[0]=(((x636*x644))+((x636*x641))+(((-0.025)*x636))+(((-1.0)*x643))+x640+(((-1.0)*x637*x642)));
evalcond[1]=((0.315)+(((-1.0)*x641*x645))+(((0.025)*x637))+(((-1.0)*x644*x645))+x638+x639+(((-1.0)*x636*x642)));
evalcond[2]=((((0.315)*x636))+((x636*x639))+((x636*x638))+((x637*x640))+(((-1.0)*x642))+(((-1.0)*x637*x643)));
evalcond[3]=((0.0346)+(((-0.01575)*x637))+(((0.63)*x637*x641))+(((-1.0)*pp))+(((0.05)*x641))+(((0.05)*x644))+(((0.63)*x646))+(((0.63)*pz*x636)));
evalcond[4]=((0.025)+(((-1.0)*x641))+(((-1.0)*x644))+((x636*x643))+(((0.315)*x637))+(((-1.0)*x636*x640))+((x637*x639))+((x637*x638)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}